

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftUCbound(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *to)

{
  type_conflict5 tVar1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  double local_d0;
  cpp_dec_float<100U,_int,_void> local_c8;
  cpp_dec_float<100U,_int,_void> local_78;
  
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 0x10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems[6] = 0;
  local_78.data._M_elems[7] = 0;
  local_78.data._M_elems[8] = 0;
  local_78.data._M_elems[9] = 0;
  local_78.data._M_elems[10] = 0;
  local_78.data._M_elems[0xb] = 0;
  local_78.data._M_elems[0xc] = 0;
  local_78.data._M_elems[0xd] = 0;
  local_78.data._M_elems._56_5_ = 0;
  local_78.data._M_elems[0xf]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_78,&to->m_backend,
             &(this->theCoUbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
  local_d0 = 0.0;
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_78,&local_d0);
  if (tVar1) {
    local_c8.fpclass = cpp_dec_float_finite;
    local_c8.prec_elem = 0x10;
    local_c8.data._M_elems[0] = 0;
    local_c8.data._M_elems[1] = 0;
    local_c8.data._M_elems[2] = 0;
    local_c8.data._M_elems[3] = 0;
    local_c8.data._M_elems[4] = 0;
    local_c8.data._M_elems[5] = 0;
    local_c8.data._M_elems[6] = 0;
    local_c8.data._M_elems[7] = 0;
    local_c8.data._M_elems[8] = 0;
    local_c8.data._M_elems[9] = 0;
    local_c8.data._M_elems[10] = 0;
    local_c8.data._M_elems[0xb] = 0;
    local_c8.data._M_elems[0xc] = 0;
    local_c8.data._M_elems[0xd] = 0;
    local_c8.data._M_elems._56_5_ = 0;
    local_c8.data._M_elems[0xf]._1_3_ = 0;
    local_c8.exp = 0;
    local_c8.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_c8,&to->m_backend,
               &(this->theCoUbound->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_c8,0.0,(type *)0x0);
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->theShift).m_backend,&local_c8);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->theCoUbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&to->m_backend);
  return;
}

Assistant:

void shiftUCbound(int i, R to)
   {
      assert(theType == LEAVE);
      // use maximum to not count tightened bounds in case of equality shifts
      theShift += SOPLEX_MAX(to - (*theCoUbound)[i], 0.0);
      (*theCoUbound)[i] = to;
   }